

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  int iVar1;
  cmGeneratorTarget *this_00;
  ostream *poVar2;
  iterator iVar3;
  cmSourceFile *this_01;
  pointer ppcVar4;
  allocator local_249;
  string obj_dir;
  string objFile;
  string tgtName;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string local_1c8;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  
  if (context->EvaluateForBuildsystem == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mapping);
    std::operator<<((ostream *)&mapping,
                    "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake.  It is not suitable for writing out elsewhere."
                   );
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&tgtName,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&tgtName,&obj_dir);
    std::__cxx11::string::~string((string *)&obj_dir);
    std::__cxx11::string::~string((string *)&tgtName);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mapping);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string
            ((string *)&tgtName,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this_00 = cmMakefile::FindGeneratorTargetToUse(context->Makefile,&tgtName);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mapping);
    poVar2 = std::operator<<((ostream *)&mapping,"Objects of target \"");
    poVar2 = std::operator<<(poVar2,(string *)&tgtName);
    std::operator<<(poVar2,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&obj_dir,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&obj_dir,&objFile);
  }
  else {
    iVar1 = cmGeneratorTarget::GetType(this_00);
    if (iVar1 == 4) {
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetObjectSources(this_00,&objectSources,&context->Config);
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mapping._M_t._M_impl.super__Rb_tree_header._M_header;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (ppcVar4 = objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppcVar4 !=
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
        std::
        map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&mapping,ppcVar4);
      }
      (*this_00->LocalGenerator->_vptr_cmLocalGenerator[0xd])
                (this_00->LocalGenerator,&mapping,this_00);
      std::__cxx11::string::string((string *)&obj_dir,(string *)&this_00->ObjectDirectory);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      for (ppcVar4 = objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppcVar4 !=
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
        iVar3 = std::
                _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&mapping._M_t,ppcVar4);
        if (iVar3._M_node[1]._M_left == (_Base_ptr)0x0) {
          __assert_fail("!map_it->second.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x517,
                        "virtual std::string TargetObjectsNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&objFile,&obj_dir,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iVar3._M_node[1]._M_parent);
        this_01 = cmMakefile::GetOrCreateSource(context->Makefile,&objFile,true);
        cmSourceFile::SetObjectLibrary(this_01,&tgtName);
        std::__cxx11::string::string((string *)&local_1c8,"EXTERNAL_OBJECT",&local_249);
        cmSourceFile::SetProperty(this_01,&local_1c8,"1");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&objFile);
      }
      std::__cxx11::string::~string((string *)&obj_dir);
      std::
      _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&mapping._M_t);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      goto LAB_0036c133;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mapping);
    poVar2 = std::operator<<((ostream *)&mapping,"Objects of target \"");
    poVar2 = std::operator<<(poVar2,(string *)&tgtName);
    std::operator<<(poVar2,"\" referenced but is not an OBJECT library.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&obj_dir,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&obj_dir,&objFile);
  }
  std::__cxx11::string::~string((string *)&objFile);
  std::__cxx11::string::~string((string *)&obj_dir);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mapping);
LAB_0036c133:
  std::__cxx11::string::~string((string *)&tgtName);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *) const
  {
    if (!context->EvaluateForBuildsystem)
      {
      std::ostringstream e;
      e << "The evaluation of the TARGET_OBJECTS generator expression "
        "is only suitable for consumption by CMake.  It is not suitable "
        "for writing out elsewhere.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }

    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt =
                context->Makefile->FindGeneratorTargetToUse(tgtName);
    if (!gt)
      {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }
    if (gt->GetType() != cmTarget::OBJECT_LIBRARY)
      {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an OBJECT library.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }

    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, context->Config);
    std::map<cmSourceFile const*, std::string> mapping;

    for(std::vector<cmSourceFile const*>::const_iterator it
        = objectSources.begin(); it != objectSources.end(); ++it)
      {
      mapping[*it];
      }

    gt->LocalGenerator->ComputeObjectFilenames(mapping, gt);

    std::string obj_dir = gt->ObjectDirectory;
    std::string result;
    const char* sep = "";
    for(std::vector<cmSourceFile const*>::const_iterator it
        = objectSources.begin(); it != objectSources.end(); ++it)
      {
      // Find the object file name corresponding to this source file.
      std::map<cmSourceFile const*, std::string>::const_iterator
        map_it = mapping.find(*it);
      // It must exist because we populated the mapping just above.
      assert(!map_it->second.empty());
      result += sep;
      std::string objFile = obj_dir + map_it->second;
      cmSourceFile* sf = context->Makefile->GetOrCreateSource(objFile, true);
      sf->SetObjectLibrary(tgtName);
      sf->SetProperty("EXTERNAL_OBJECT", "1");
      result += objFile;
      sep = ";";
      }
    return result;
  }